

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawSplineCatmullRom(Vector2 *points,int pointCount,float thick,Color color)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Vector2 center;
  int iVar10;
  long lVar11;
  ulong uVar12;
  float radius;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Vector2 vertices [50];
  float local_29c;
  float local_278;
  float fStack_274;
  Vector2 local_228;
  undefined1 local_1d8 [8];
  float afStack_1d0 [2];
  Vector2 local_1c8;
  float local_1c0;
  float local_1bc;
  float afStack_1b8 [98];
  
  if (3 < pointCount) {
    center = points[1];
    memset(&local_1c8,0,400);
    radius = thick * 0.5;
    DrawCircleSector(center,radius,0.0,360.0,0x24,color);
    local_278 = center.x;
    fStack_274 = center.y;
    fVar16 = 0.0;
    fVar18 = 0.0;
    local_29c = 0.0;
    fVar14 = 0.0;
    uVar12 = 0;
    fVar20 = local_1c8.y;
    fVar22 = local_1c0;
    fVar15 = local_1bc;
    do {
      if (uVar12 != 0) {
        local_1c0 = local_278 - fVar16 * local_29c;
        local_1c8.x = fVar16 * local_29c + local_278;
        local_1c8.y = fStack_274 - fVar18 * local_29c;
        local_1bc = fVar18 * local_29c + fStack_274;
        fVar20 = local_1c8.y;
        fVar22 = local_1c0;
        fVar15 = local_1bc;
        fVar14 = local_1c8.x;
      }
      fVar2 = points[uVar12].x;
      fVar3 = points[uVar12].y;
      uVar1 = uVar12 + 1;
      fVar4 = points[uVar12 + 1].x;
      fVar5 = points[uVar12 + 1].y;
      fVar6 = points[uVar12 + 2].x;
      fVar7 = points[uVar12 + 2].y;
      fVar8 = points[uVar12 + 3].x;
      fVar9 = points[uVar12 + 3].y;
      lVar11 = 0x1c;
      iVar10 = 1;
      fVar21 = local_278;
      do {
        fVar17 = (float)iVar10 / 24.0;
        fVar19 = fVar17 * fVar17 * fVar17;
        fVar16 = ((fVar17 + fVar17) * fVar17 - fVar19) - fVar17;
        fVar18 = fVar17 * 3.0 * fVar17 * fVar17 + fVar17 * -5.0 * fVar17 + 2.0;
        fVar13 = fVar17 * -3.0 * fVar17 * fVar17 + fVar17 * 4.0 * fVar17 + fVar17;
        fVar19 = fVar19 - fVar17 * fVar17;
        local_278 = (fVar8 * fVar19 + fVar6 * fVar13 + fVar2 * fVar16 + fVar4 * fVar18) * 0.5;
        fVar16 = (fVar19 * fVar9 + fVar13 * fVar7 + fVar16 * fVar3 + fVar18 * fVar5) * 0.5;
        _local_1d8 = ZEXT416((uint)fVar16);
        fVar16 = fVar16 - fStack_274;
        fVar18 = local_278 - fVar21;
        local_29c = fVar18 * fVar18 + fVar16 * fVar16;
        if (local_29c < 0.0) {
          local_29c = sqrtf(local_29c);
        }
        else {
          local_29c = SQRT(local_29c);
        }
        local_29c = radius / local_29c;
        fVar13 = fVar16 * local_29c;
        fVar17 = fVar18 * local_29c;
        if (lVar11 == 0x1c && uVar12 == 0) {
          fVar14 = fVar13 + fVar21;
          fVar22 = fVar21 - fVar13;
          fVar15 = fVar17 + fStack_274;
          fVar20 = fStack_274 - fVar17;
        }
        *(float *)(local_1d8 + lVar11 + 0xc) = local_278 - fVar13;
        fStack_274 = (float)local_1d8._0_4_;
        *(float *)((long)&local_1c8.x + lVar11) = fVar17 + (float)local_1d8._0_4_;
        *(float *)(local_1d8 + lVar11 + 4) = fVar13 + local_278;
        *(float *)(local_1d8 + lVar11 + 8) = (float)local_1d8._0_4_ - fVar17;
        lVar11 = lVar11 + 0x10;
        iVar10 = iVar10 + 1;
        fVar21 = local_278;
      } while (lVar11 != 0x19c);
      local_228.y = (float)local_1d8._0_4_;
      local_228.x = local_278;
      local_1c8.x = fVar14;
      local_1c8.y = fVar20;
      local_1c0 = fVar22;
      local_1bc = fVar15;
      DrawTriangleStrip(&local_1c8,0x32,color);
      uVar12 = uVar1;
    } while (uVar1 != pointCount - 3);
    DrawCircleSector(local_228,radius,0.0,360.0,0x24,color);
  }
  return;
}

Assistant:

void DrawSplineCatmullRom(const Vector2 *points, int pointCount, float thick, Color color)
{
    if (pointCount < 4) return;

    float dy = 0.0f;
    float dx = 0.0f;
    float size = 0.0f;

    Vector2 currentPoint = points[1];
    Vector2 nextPoint = { 0 };
    Vector2 vertices[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    DrawCircleV(currentPoint, thick/2.0f, color);   // Draw init line circle-cap

    for (int i = 0; i < (pointCount - 3); i++)
    {
        float t = 0.0f;
        Vector2 p1 = points[i], p2 = points[i + 1], p3 = points[i + 2], p4 = points[i + 3];

        if (i > 0)
        {
            vertices[0].x = currentPoint.x + dy*size;
            vertices[0].y = currentPoint.y - dx*size;
            vertices[1].x = currentPoint.x - dy*size;
            vertices[1].y = currentPoint.y + dx*size;
        }

        for (int j = 1; j <= SPLINE_SEGMENT_DIVISIONS; j++)
        {
            t = ((float)j)/((float)SPLINE_SEGMENT_DIVISIONS);

            float q0 = (-1.0f*t*t*t) + (2.0f*t*t) + (-1.0f*t);
            float q1 = (3.0f*t*t*t) + (-5.0f*t*t) + 2.0f;
            float q2 = (-3.0f*t*t*t) + (4.0f*t*t) + t;
            float q3 = t*t*t - t*t;

            nextPoint.x = 0.5f*((p1.x*q0) + (p2.x*q1) + (p3.x*q2) + (p4.x*q3));
            nextPoint.y = 0.5f*((p1.y*q0) + (p2.y*q1) + (p3.y*q2) + (p4.y*q3));

            dy = nextPoint.y - currentPoint.y;
            dx = nextPoint.x - currentPoint.x;
            size = (0.5f*thick)/sqrtf(dx*dx + dy*dy);

            if ((i == 0) && (j == 1))
            {
                vertices[0].x = currentPoint.x + dy*size;
                vertices[0].y = currentPoint.y - dx*size;
                vertices[1].x = currentPoint.x - dy*size;
                vertices[1].y = currentPoint.y + dx*size;
            }

            vertices[2*j + 1].x = nextPoint.x - dy*size;
            vertices[2*j + 1].y = nextPoint.y + dx*size;
            vertices[2*j].x = nextPoint.x + dy*size;
            vertices[2*j].y = nextPoint.y - dx*size;

            currentPoint = nextPoint;
        }

        DrawTriangleStrip(vertices, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
    }

    // Cap circle drawing at the end of every segment
    DrawCircleV(currentPoint, thick/2.0f, color);
}